

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_transcoding_pipeline_buffer_id_t eVar1;
  bool bVar2;
  exr_result_t eVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  undefined8 uVar7;
  exr_const_context_t p_Var8;
  code *UNRECOVERED_JUMPTABLE;
  
  if (newsz == 0) {
    p_Var8 = encode->context;
    if (p_Var8 == (exr_const_context_t)0x0) {
      return 2;
    }
    eVar1 = encode->part_index;
    if ((-1 < (int)eVar1) && ((int)eVar1 < *(int *)(p_Var8 + 0xc4))) {
      UNRECOVERED_JUMPTABLE = *(code **)(p_Var8 + 0x48);
      pcVar6 = "Attempt to allocate 0 byte buffer for transcode buffer %d";
      uVar7 = 3;
      goto LAB_0012463c;
    }
  }
  else {
    pvVar4 = *buf;
    if ((pvVar4 != (void *)0x0) && (newsz <= *cursz)) {
      return 0;
    }
    internal_encode_free_buffer(encode,bufid,buf,cursz);
    if (encode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      p_Var8 = encode->context;
      if (p_Var8 == (exr_const_context_t)0x0) {
        pvVar5 = (void *)0x2;
        bVar2 = false;
      }
      else if ((encode->part_index < 0) || (*(int *)(p_Var8 + 0xc4) <= encode->part_index)) {
        bVar2 = false;
        pvVar5 = (void *)(**(code **)(p_Var8 + 0x48))(p_Var8,4,"Part index (%d) out of range");
      }
      else {
        pvVar5 = (void *)(**(code **)(p_Var8 + 0x58))(newsz);
        bVar2 = true;
        pvVar4 = pvVar5;
      }
      if (!bVar2) {
        return (exr_result_t)pvVar5;
      }
    }
    else {
      pvVar4 = (*encode->alloc_fn)(bufid,newsz);
    }
    if (pvVar4 != (void *)0x0) {
      *buf = pvVar4;
      *cursz = newsz;
      return 0;
    }
    p_Var8 = encode->context;
    if (p_Var8 == (exr_const_context_t)0x0) {
      return 2;
    }
    eVar1 = encode->part_index;
    if ((-1 < (int)eVar1) && ((int)eVar1 < *(int *)(p_Var8 + 0xc4))) {
      eVar3 = (**(code **)(p_Var8 + 0x48))
                        (p_Var8,1,"Unable to allocate %lu bytes",newsz,*(code **)(p_Var8 + 0x48));
      return eVar3;
    }
  }
  bufid = eVar1;
  UNRECOVERED_JUMPTABLE = *(code **)(p_Var8 + 0x48);
  pcVar6 = "Part index (%d) out of range";
  uVar7 = 4;
LAB_0012463c:
  eVar3 = (*UNRECOVERED_JUMPTABLE)(p_Var8,uVar7,pcVar6,bufid,UNRECOVERED_JUMPTABLE);
  return eVar3;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
            encode->context, encode->part_index);

        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            curbuf = pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}